

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

float_specs
duckdb_fmt::v6::internal::parse_float_type_spec<duckdb_fmt::v6::internal::error_handler,char>
          (basic_format_specs<char> *specs,error_handler *eh)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  string *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  float_specs result;
  undefined4 in_stack_ffffffffffffff58;
  error_handler *in_stack_ffffffffffffff70;
  allocator local_79;
  string local_78 [112];
  float_specs local_8;
  
  local_8.precision = 0;
  iVar1 = local_8.precision;
  local_8 = (float_specs)((ulong)*(byte *)(in_RDI + 0x10) << 0x30);
  uVar4 = (uint)(*(byte *)(in_RDI + 9) >> 7);
  uVar2 = local_8._4_4_ | uVar4 << 0x1d;
  message = (string *)(ulong)(uint)(int)*(char *)(in_RDI + 8);
  switch(message) {
  case (string *)0x0:
    local_8 = (float_specs)
              ((ulong)(local_8._4_4_ | (uint)(uVar4 != 0 || *(int *)(in_RDI + 4) != 0) << 0x1d) <<
              0x20);
    break;
  default:
    iVar3 = (int)*(char *)(in_RDI + 8);
    local_8.precision = iVar1;
    local_8._4_4_ = uVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,1,(char)iVar3,&local_79);
    std::operator+((char *)CONCAT44(iVar3,in_stack_ffffffffffffff58),in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar3,in_stack_ffffffffffffff58),(char *)in_RSI);
    error_handler::on_error(in_stack_ffffffffffffff70,message);
  case (string *)0x41:
    uVar2 = uVar2 | 0x1000000;
  case (string *)0x61:
    local_8._4_4_ = uVar2;
    local_8 = (float_specs)((ulong)(uint)local_8._4_4_ << 0x20 | 0x300000000);
    break;
  case (string *)0x45:
    uVar2 = uVar2 | 0x1000000;
  case (string *)0x65:
    local_8._4_4_ = uVar2;
    local_8 = (float_specs)
              ((ulong)(local_8._4_4_ & 0xdfffffff | 1 |
                      (uint)((uint)local_8._4_4_ >> 0x1d != 0 || *(int *)(in_RDI + 4) != 0) << 0x1d)
              << 0x20);
    break;
  case (string *)0x46:
    uVar2 = uVar2 | 0x1000000;
  case (string *)0x66:
    local_8._4_4_ = uVar2;
    local_8 = (float_specs)
              ((ulong)(local_8._4_4_ & 0xdfffffff | 2 |
                      (uint)((uint)local_8._4_4_ >> 0x1d != 0 || *(int *)(in_RDI + 4) != 0) << 0x1d)
              << 0x20);
    break;
  case (string *)0x47:
    local_8._4_4_ = uVar2 | 0x1000000;
    uVar2 = local_8._4_4_;
  case (string *)0x67:
    local_8._4_4_ = uVar2;
    local_8 = (float_specs)((ulong)(uint)local_8._4_4_ << 0x20);
    break;
  case (string *)0x4c:
  case (string *)0x6c:
  case (string *)0x6e:
    local_8 = (float_specs)((ulong)uVar2 << 0x20 | 0x200000000000000);
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR float_specs parse_float_type_spec(
    const basic_format_specs<Char>& specs, ErrorHandler&& eh = {}) {

  auto result = float_specs();
  result.thousand_sep = specs.thousands;
  result.trailing_zeros = specs.alt;
  switch (specs.type) {
  case 0:
    result.format = float_format::general;
    result.trailing_zeros |= specs.precision != 0;
    break;
  case 'G':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'g':
    result.format = float_format::general;
    break;
  case 'E':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'e':
    result.format = float_format::exp;
    result.trailing_zeros |= specs.precision != 0;
    break;
  case 'F':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'f':
    result.format = float_format::fixed;
    result.trailing_zeros |= specs.precision != 0;
    break;
#if FMT_DEPRECATED_PERCENT
  case '%':
    result.format = float_format::fixed;
    result.percent = true;
    break;
#endif
  case 'A':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'a':
    result.format = float_format::hex;
    break;
  case 'n':
  case 'l':
  case 'L':
    result.locale = true;
    break;
  default:
    eh.on_error("Invalid type specifier \"" + std::string(1, specs.type) + "\" for formatting a value of type float");
    break;
  }
  return result;
}